

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict type_spec(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  parse_ctx *ppVar1;
  parse_ctx *ppVar2;
  node_t pnVar3;
  tpname_t el;
  int iVar4;
  int iVar5;
  int iVar6;
  node_t_conflict pnVar7;
  char *expected_name;
  node_t_conflict pnVar8;
  node_t_conflict pnVar9;
  node_t_conflict pnVar10;
  node_t_conflict op4;
  node_code_t nVar11;
  code *pcVar12;
  node_t_conflict *ppnVar13;
  pos_t p;
  pos_t pVar14;
  pos_t pos;
  node_t_conflict local_b0;
  node_t_conflict local_a8;
  node_t_conflict local_a0;
  node_t_conflict local_78;
  node_t_conflict pnStack_70;
  undefined8 local_68;
  node_t_conflict local_60;
  node_t_conflict local_58;
  node_t_conflict op1;
  int local_40;
  parse_ctx *local_38;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar4 = match(c2m_ctx,0x13a,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_VOID;
LAB_00165ba4:
    p.lno = pos.lno;
    p.ln_pos = pos.ln_pos;
    p.fname = pos.fname;
    pnVar7 = new_pos_node(c2m_ctx,nVar11,p);
    return pnVar7;
  }
  iVar4 = match(c2m_ctx,0x11d,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_CHAR;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x130,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_SHORT;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,299,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_INT;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,300,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_LONG;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x126,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_FLOAT;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x122,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_DOUBLE;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x131,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_SIGNED;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x139,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_UNSIGNED;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x110,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    nVar11 = N_BOOL;
    goto LAB_00165ba4;
  }
  iVar4 = match(c2m_ctx,0x111,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 != 0) {
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    error(c2m_ctx,0x18e8dc,pos.fname,pos._8_8_);
    return &err_struct;
  }
  iVar4 = match(c2m_ctx,0x114,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 == 0) {
    iVar4 = match(c2m_ctx,0x134,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if ((iVar4 == 0) &&
       (iVar5 = match(c2m_ctx,0x138,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0), iVar5 == 0)) {
      iVar4 = match(c2m_ctx,0x124,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar4 == 0) {
        if (arg != (node_t_conflict)0x0) {
          return &err_struct;
        }
        ppVar1 = c2m_ctx->parse_ctx;
        iVar4 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&local_58);
        if (iVar4 != 0) {
          ppnVar13 = &ppVar1->curr_scope;
          do {
            pnVar7 = *ppnVar13;
            local_78 = local_58;
            el.scope = pnVar7;
            el.id = local_58;
            el._16_8_ = local_68;
            pnStack_70 = pnVar7;
            iVar4 = HTAB_tpname_t_do(c2m_ctx->parse_ctx->tpname_tab,el,HTAB_FIND,(tpname_t *)&op1);
            if (iVar4 != 0) {
              if (local_40 == 0) {
                return &err_struct;
              }
              return local_58;
            }
            ppnVar13 = (node_t_conflict *)&pnVar7->attr;
          } while (pnVar7 != (node_t_conflict)0x0);
          return &err_struct;
        }
        if (ppVar1->record_level != 0) {
          return &err_struct;
        }
LAB_0016633d:
        expected_name = "identifier";
        goto LAB_00165e30;
      }
      iVar4 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&op1);
      if (iVar4 == 0) {
        op1 = new_node(c2m_ctx,N_IGNORE);
      }
      local_a8 = new_node(c2m_ctx,N_LIST);
      iVar5 = match(c2m_ctx,0x7b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar5 == 0) {
        if (iVar4 == 0) goto LAB_00166319;
        local_a8 = new_node(c2m_ctx,N_IGNORE);
      }
      else {
        do {
          iVar4 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&local_78);
          pnVar7 = local_78;
          if (iVar4 == 0) {
            if (ppVar1->record_level != 0) {
              return &err_struct;
            }
            goto LAB_0016633d;
          }
          iVar4 = match(c2m_ctx,0x3d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar4 == 0) {
            pnVar8 = new_node(c2m_ctx,N_IGNORE);
          }
          else {
            pnVar8 = cond_expr(c2m_ctx,no_err_p);
            local_78 = pnVar8;
            if (pnVar8 == &err_struct) {
              return &err_struct;
            }
          }
          pnVar7 = new_node2(c2m_ctx,N_ENUM_CONST,pnVar7,pnVar8);
          op_append(c2m_ctx,local_a8,pnVar7);
          iVar4 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        } while ((iVar4 != 0) && (*(short *)ppVar1->curr_token != 0x7d));
        iVar4 = match(c2m_ctx,0x7d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar4 == 0) goto LAB_00165da7;
      }
      nVar11 = N_ENUM;
      goto LAB_00165e0a;
    }
    iVar5 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&op1);
    if (iVar5 == 0) {
      op1 = new_node(c2m_ctx,N_IGNORE);
    }
    iVar6 = match(c2m_ctx,0x7b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar6 == 0) {
      if (iVar5 == 0) {
LAB_00166319:
        return &err_struct;
      }
      local_a8 = new_node(c2m_ctx,N_IGNORE);
      local_78 = local_a8;
    }
    else {
      if ((*(short *)ppVar1->curr_token == 0x7d) ||
         (iVar5 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0),
         iVar5 != 0)) {
        pcVar12 = error;
        if (c2m_ctx->options->pedantic_p == 0) {
          pcVar12 = warning;
        }
        (*pcVar12)(c2m_ctx,pos.fname,pos._8_8_);
        local_78 = new_node(c2m_ctx,N_LIST);
      }
      else {
        local_38 = c2m_ctx->parse_ctx;
        pnVar7 = new_node(c2m_ctx,N_LIST);
        do {
          ppVar2 = c2m_ctx->parse_ctx;
          if (*(short *)ppVar2->curr_token == 0x117) {
            local_b0 = st_assert(c2m_ctx,no_err_p);
          }
          else {
            local_60 = spec_qual_list(c2m_ctx,no_err_p);
            if (local_60 == &err_struct) {
              return &err_struct;
            }
            local_b0 = new_node(c2m_ctx,N_LIST);
            iVar5 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            pnVar8 = local_60;
            if (iVar5 == 0) {
              do {
                if (*(short *)ppVar2->curr_token == 0x3a) {
                  pnVar8 = new_node(c2m_ctx,N_IGNORE);
LAB_001660e5:
                  local_a0 = new_node(c2m_ctx,N_IGNORE);
                }
                else {
                  pnVar8 = declarator(c2m_ctx,no_err_p);
                  if (pnVar8 == &err_struct) {
                    return &err_struct;
                  }
                  local_a0 = try_attr_spec(c2m_ctx,ppVar2->curr_token->pos,(node_t_conflict *)0x0);
                  if (local_a0 == &err_struct) goto LAB_001660e5;
                }
                iVar5 = match(c2m_ctx,0x3a,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar5 == 0) {
                  pnVar9 = new_node(c2m_ctx,N_IGNORE);
                }
                else {
                  pnVar9 = cond_expr(c2m_ctx,no_err_p);
                  if (pnVar9 == &err_struct) {
                    return &err_struct;
                  }
                }
                pVar14 = get_node_pos(c2m_ctx,pnVar8);
                pnVar10 = new_node1(c2m_ctx,N_SHARE,local_60);
                pnVar8 = new_pos_node4(c2m_ctx,N_MEMBER,pVar14,pnVar10,pnVar8,local_a0,pnVar9);
                op_append(c2m_ctx,local_b0,pnVar8);
                iVar5 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              } while (iVar5 != 0);
              iVar5 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar5 == 0) {
                if (ppVar2->record_level != 0) {
                  return &err_struct;
                }
                iVar4 = 0x3b;
                goto LAB_00165e21;
              }
            }
            else {
              pVar14 = get_node_pos(c2m_ctx,local_60);
              pnVar8 = new_node1(c2m_ctx,N_SHARE,pnVar8);
              pnVar9 = new_node(c2m_ctx,N_IGNORE);
              pnVar10 = new_node(c2m_ctx,N_IGNORE);
              op4 = new_node(c2m_ctx,N_IGNORE);
              pnVar8 = new_pos_node4(c2m_ctx,N_MEMBER,pVar14,pnVar8,pnVar9,pnVar10,op4);
              op_append(c2m_ctx,local_b0,pnVar8);
            }
          }
          if (local_b0 == &err_struct) {
            return &err_struct;
          }
          if (local_b0->code == N_LIST) {
            pnVar8 = (local_b0->u).ops.head;
            while (pnVar8 != (node_t_conflict)0x0) {
              pnVar3 = (pnVar8->op_link).next;
              DLIST_node_t_remove(&(local_b0->u).ops,pnVar8);
              op_append(c2m_ctx,pnVar7,pnVar8);
              pnVar8 = pnVar3;
            }
          }
          else {
            op_append(c2m_ctx,pnVar7,local_b0);
          }
        } while (*(short *)local_38->curr_token != 0x7d);
        local_78 = pnVar7;
        if (pnVar7 == &err_struct) {
          return &err_struct;
        }
      }
      local_a8 = local_78;
      iVar5 = match(c2m_ctx,0x7d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar5 == 0) {
LAB_00165da7:
        if (ppVar1->record_level != 0) {
          return &err_struct;
        }
        iVar4 = 0x7d;
        goto LAB_00165e21;
      }
    }
    nVar11 = (iVar4 == 0) + N_STRUCT;
LAB_00165e0a:
    pVar14.lno = pos.lno;
    pVar14.ln_pos = pos.ln_pos;
    pVar14.fname = pos.fname;
    pnVar7 = new_pos_node2(c2m_ctx,nVar11,pVar14,op1,local_a8);
    return pnVar7;
  }
  iVar4 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar4 == 0) {
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    iVar4 = 0x28;
  }
  else {
    pnVar7 = type_name(c2m_ctx,no_err_p);
    if (pnVar7 == &err_struct) {
      return &err_struct;
    }
    iVar4 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar4 != 0) {
      error(c2m_ctx,0x18e8fe,pos.fname,pos._8_8_);
      return pnVar7;
    }
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    iVar4 = 0x29;
  }
LAB_00165e21:
  expected_name = get_token_name(c2m_ctx,iVar4);
LAB_00165e30:
  syntax_error(c2m_ctx,expected_name);
  return &err_struct;
}

Assistant:

DA (type_spec) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, op2, op3, op4, r;
  int struct_p, id_p = FALSE;
  pos_t pos;

  if (MP (T_VOID, pos)) {
    r = new_pos_node (c2m_ctx, N_VOID, pos);
  } else if (MP (T_CHAR, pos)) {
    r = new_pos_node (c2m_ctx, N_CHAR, pos);
  } else if (MP (T_SHORT, pos)) {
    r = new_pos_node (c2m_ctx, N_SHORT, pos);
  } else if (MP (T_INT, pos)) {
    r = new_pos_node (c2m_ctx, N_INT, pos);
  } else if (MP (T_LONG, pos)) {
    r = new_pos_node (c2m_ctx, N_LONG, pos);
  } else if (MP (T_FLOAT, pos)) {
    r = new_pos_node (c2m_ctx, N_FLOAT, pos);
  } else if (MP (T_DOUBLE, pos)) {
    r = new_pos_node (c2m_ctx, N_DOUBLE, pos);
  } else if (MP (T_SIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_SIGNED, pos);
  } else if (MP (T_UNSIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_UNSIGNED, pos);
  } else if (MP (T_BOOL, pos)) {
    r = new_pos_node (c2m_ctx, N_BOOL, pos);
  } else if (MP (T_COMPLEX, pos)) {
    if (record_level == 0) error (c2m_ctx, pos, "complex numbers are not supported");
    return err_node;
  } else if (MP (T_ATOMIC, pos)) { /* atomic-type-specifier */
    PT ('(');
    P (type_name);
    PT (')');
    error (c2m_ctx, pos, "Atomic types are not supported");
  } else if ((struct_p = MP (T_STRUCT, pos)) || MP (T_UNION, pos)) {
    /* struct-or-union-specifier, struct-or-union */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    if (M ('{')) {
      if (!C ('}') && !M (';')) {
        P (struct_declaration_list);
      } else {
        (c2m_options->pedantic_p ? error : warning) (c2m_ctx, pos, "empty struct/union");
        r = new_node (c2m_ctx, N_LIST);
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      r = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, struct_p ? N_STRUCT : N_UNION, pos, op1, r);
  } else if (MP (T_ENUM, pos)) { /* enum-specifier */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    op2 = new_node (c2m_ctx, N_LIST);
    if (M ('{')) { /* enumerator-list */
      for (;;) {   /* enumerator */
        PTN (T_ID);
        op3 = r; /* enumeration-constant */
        if (!M ('=')) {
          op4 = new_node (c2m_ctx, N_IGNORE);
        } else {
          P (const_expr);
          op4 = r;
        }
        op_append (c2m_ctx, op2, new_node2 (c2m_ctx, N_ENUM_CONST, op3, op4));
        if (!M (',')) break;
        if (C ('}')) break;
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      op2 = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, N_ENUM, pos, op1, op2);
  } else if (arg == NULL) {
    P (typedef_name);
  } else {
    r = err_node;
  }
  return r;
}